

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O0

iterator __thiscall
spvtools::opt::anon_unknown_0::LoopUnswitch::FindBasicBlockPosition
          (LoopUnswitch *this,BasicBlock *bb_to_find)

{
  Function *this_00;
  bool bVar1;
  uint32_t bb_id;
  iterator local_38;
  BasicBlock *local_28;
  BasicBlock *bb_to_find_local;
  LoopUnswitch *this_local;
  iterator it;
  
  this_00 = this->function_;
  local_28 = bb_to_find;
  bb_to_find_local = (BasicBlock *)this;
  bb_id = BasicBlock::id(bb_to_find);
  _this_local = Function::FindBlock(this_00,bb_id);
  local_38 = Function::end(this->function_);
  bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                    ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&this_local,&local_38);
  if (!bVar1) {
    __assert_fail("it != function_->end() && \"Basic Block not found\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                  ,0x57,
                  "Function::iterator spvtools::opt::(anonymous namespace)::LoopUnswitch::FindBasicBlockPosition(BasicBlock *)"
                 );
  }
  return _this_local;
}

Assistant:

Function::iterator FindBasicBlockPosition(BasicBlock* bb_to_find) {
    Function::iterator it = function_->FindBlock(bb_to_find->id());
    assert(it != function_->end() && "Basic Block not found");
    return it;
  }